

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool __thiscall testing::internal::String::EndsWith(String *this,char *suffix)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  char *in_RSI;
  String *in_RDI;
  size_t suffix_len;
  size_t this_len;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  bool local_1;
  
  if ((in_RSI == (char *)0x0) ||
     (bVar1 = CStringEquals((char *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
                            (char *)0x1ed221), bVar1)) {
    local_1 = true;
  }
  else {
    pcVar2 = c_str(in_RDI);
    if (pcVar2 == (char *)0x0) {
      local_1 = false;
    }
    else {
      pcVar2 = c_str(in_RDI);
      sVar3 = strlen(pcVar2);
      sVar4 = strlen(in_RSI);
      local_1 = false;
      if (sVar4 <= sVar3) {
        c_str(in_RDI);
        local_1 = CStringEquals((char *)CONCAT17(local_1,in_stack_ffffffffffffffc8),(char *)0x1ed2a6
                               );
      }
    }
  }
  return local_1;
}

Assistant:

bool String::EndsWith(const char* suffix) const {
  if (suffix == NULL || CStringEquals(suffix, "")) return true;

  if (c_str() == NULL) return false;

  const size_t this_len = strlen(c_str());
  const size_t suffix_len = strlen(suffix);
  return (this_len >= suffix_len) &&
         CStringEquals(c_str() + this_len - suffix_len, suffix);
}